

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void quoteFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  Mem *pMVar1;
  long lVar2;
  u8 uVar3;
  uint uVar4;
  void *pvVar5;
  char *pcVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  double dVar8;
  StrAccum local_58;
  double local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.db = context->pOut->db;
  local_58.zText = (char *)0x0;
  local_58._16_8_ = (ulong)(uint)(local_58.db)->aLimit[0] << 0x20;
  local_58.nChar = 0;
  local_58.accError = '\0';
  local_58.printfFlags = '\0';
  local_58._30_2_ = 0xaaaa;
  pMVar1 = *argv;
  switch("\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x04\x05\x03\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05"
         [pMVar1->flags & 0x3f]) {
  case '\x01':
    pvVar5 = (void *)sqlite3VdbeIntValue(pMVar1);
    pcVar6 = "%lld";
    goto LAB_001b0dbe;
  case '\x02':
    local_38 = -NAN;
    dVar8 = sqlite3VdbeRealValue(pMVar1);
    sqlite3_str_appendf(&local_58,"%!0.15g");
    if ((local_58._24_8_ & 0xffffffff) == 0) {
      pcVar6 = (char *)0x0;
    }
    else {
      local_58.zText[local_58._24_8_ & 0xffffffff] = '\0';
      pcVar6 = local_58.zText;
    }
    if (pcVar6 != (char *)0x0) {
      sqlite3AtoF(pcVar6,&local_38,local_58.nChar,'\x01');
      if ((dVar8 != local_38) || (NAN(dVar8) || NAN(local_38))) {
        uVar3 = local_58.printfFlags;
        if ((local_58._24_8_ & 0x40000000000) != 0) {
          if (local_58.zText != (char *)0x0) {
            sqlite3DbFreeNN(local_58.db,local_58.zText);
          }
          local_58._24_8_ =
               CONCAT26(local_58._30_2_,CONCAT15(uVar3,local_58._24_5_)) & 0xfffffbffffffffff;
        }
        local_58._16_8_ = local_58._16_8_ & 0xffffffff00000000;
        local_58._24_8_ = local_58._24_8_ & 0xffffffff00000000;
        local_58.zText = (char *)0x0;
        sqlite3_str_appendf(&local_58,"%!0.20e",dVar8);
      }
    }
    break;
  case '\x03':
    pvVar5 = sqlite3ValueText(pMVar1,'\x01');
    pcVar6 = "%Q";
LAB_001b0dbe:
    sqlite3_str_appendf(&local_58,pcVar6,pvVar5);
    break;
  case '\x04':
    pvVar5 = sqlite3_value_blob(pMVar1);
    uVar4 = sqlite3ValueBytes(pMVar1,'\x01');
    sqlite3StrAccumEnlarge(&local_58,(long)(int)uVar4 * 2 + 4);
    if (local_58.accError == '\0') {
      lVar2 = (long)(int)uVar4 * 2;
      if (0 < (int)uVar4) {
        uVar7 = 0;
        do {
          local_58.zText[uVar7 * 2 + 2] = "0123456789ABCDEF"[*(byte *)((long)pvVar5 + uVar7) >> 4];
          local_58.zText[uVar7 * 2 + 3] = "0123456789ABCDEF"[*(byte *)((long)pvVar5 + uVar7) & 0xf];
          uVar7 = uVar7 + 1;
        } while (uVar4 != uVar7);
      }
      (local_58.zText + lVar2 + 2)[0] = '\'';
      (local_58.zText + lVar2 + 2)[1] = '\0';
      local_58.zText[0] = 'X';
      local_58.zText[1] = '\'';
      local_58.nChar = (int)lVar2 + 3;
    }
    break;
  default:
    enlargeAndAppend(&local_58,"NULL",4);
  }
  pcVar6 = sqlite3StrAccumFinish(&local_58);
  setResultStrOrError(context,pcVar6,local_58.nChar,'\x01',sqlite3OomClear);
  uVar3 = local_58.accError;
  if (local_58.accError == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
  }
  else {
    pMVar1 = context->pOut;
    if ((pMVar1->flags & 0x9000) == 0) {
      pMVar1->flags = 1;
    }
    else {
      vdbeMemClearExternAndSetNull(pMVar1);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      sqlite3_result_error_code(context,(uint)uVar3);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

static void quoteFunc(sqlite3_context *context, int argc, sqlite3_value **argv){
  sqlite3_str str;
  sqlite3 *db = sqlite3_context_db_handle(context);
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  sqlite3StrAccumInit(&str, db, 0, 0, db->aLimit[SQLITE_LIMIT_LENGTH]);
  sqlite3QuoteValue(&str,argv[0]);
  sqlite3_result_text(context, sqlite3StrAccumFinish(&str), str.nChar,
                      SQLITE_DYNAMIC);
  if( str.accError!=SQLITE_OK ){
    sqlite3_result_null(context);
    sqlite3_result_error_code(context, str.accError);
  }
}